

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_DefinePropertyGetSet
              (JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue getter,JSValue setter,int flags)

{
  int iVar1;
  int iVar2;
  
  iVar2 = JS_DefineProperty(ctx,this_obj,prop,(JSValue)(ZEXT816(3) << 0x40),getter,setter,
                            flags | 0x1d00);
  if ((0xfffffff4 < (uint)getter.tag) &&
     (iVar1 = *getter.u.ptr, *(int *)getter.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,getter);
  }
  if ((0xfffffff4 < (uint)setter.tag) &&
     (iVar1 = *setter.u.ptr, *(int *)setter.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,setter);
  }
  return iVar2;
}

Assistant:

int JS_DefinePropertyGetSet(JSContext *ctx, JSValueConst this_obj,
                            JSAtom prop, JSValue getter, JSValue setter,
                            int flags)
{
    int ret;
    ret = JS_DefineProperty(ctx, this_obj, prop, JS_UNDEFINED, getter, setter,
                            flags | JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                            JS_PROP_HAS_CONFIGURABLE | JS_PROP_HAS_ENUMERABLE);
    JS_FreeValue(ctx, getter);
    JS_FreeValue(ctx, setter);
    return ret;
}